

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

char * curl_unescape(char *string,int length)

{
  char *pcVar1;
  
  pcVar1 = curl_easy_unescape((Curl_easy *)string,string,length,(int *)0x0);
  return pcVar1;
}

Assistant:

char *curl_unescape(const char *string, int length)
{
  return curl_easy_unescape(NULL, string, length, NULL);
}